

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HL1MDLLoader.cpp
# Opt level: O2

bool Assimp::MDL::HalfLife::HL1MDLLoader::get_num_blend_controllers
               (int num_blend_animations,int *num_blend_controllers)

{
  Logger *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  if (num_blend_animations == 4) {
    *num_blend_controllers = 2;
  }
  else if (num_blend_animations == 2) {
    *num_blend_controllers = 1;
  }
  else {
    if (num_blend_animations != 1) {
      *num_blend_controllers = 0;
      this = DefaultLogger::get();
      std::__cxx11::to_string(&local_38,num_blend_animations);
      std::operator+(&bStack_78,"[Half-Life 1 MDL] Unsupported number of blend animations (",
                     &local_38);
      std::operator+(&local_58,&bStack_78,")");
      Logger::warn(this,local_58._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_58);
      std::__cxx11::string::~string((string *)&bStack_78);
      std::__cxx11::string::~string((string *)&local_38);
      return false;
    }
    *num_blend_controllers = 0;
  }
  return true;
}

Assistant:

bool HL1MDLLoader::get_num_blend_controllers(const int num_blend_animations, int &num_blend_controllers) {

    switch (num_blend_animations) {
        case SequenceBlendMode_HL1::NoBlend:
            num_blend_controllers = 0;
            return true;
        case SequenceBlendMode_HL1::TwoWayBlending:
            num_blend_controllers = 1;
            return true;
        case SequenceBlendMode_HL1::FourWayBlending:
            num_blend_controllers = 2;
            return true;
        default:
            num_blend_controllers = 0;
            ASSIMP_LOG_WARN(MDL_HALFLIFE_LOG_HEADER "Unsupported number of blend animations (" + std::to_string(num_blend_animations) + ")");
            return false;
    }
}